

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_message.cc
# Opt level: O2

LogMessage * __thiscall
absl::lts_20250127::log_internal::LogMessage::ToSinkAlso
          (LogMessage *this,Nonnull<absl::LogSink_*> sink)

{
  allocator<char> local_51;
  Nonnull<absl::LogSink_*> sink_local;
  allocator<char> local_48 [32];
  string death_message;
  
  sink_local = sink;
  if (sink != (Nonnull<absl::LogSink_*>)0x0) {
    inlined_vector_internal::
    Storage<absl::lts_20250127::LogSink*,16ul,std::allocator<absl::lts_20250127::LogSink*>>::
    EmplaceBack<absl::lts_20250127::LogSink*const&>
              ((Storage<absl::lts_20250127::LogSink*,16ul,std::allocator<absl::lts_20250127::LogSink*>>
                *)&((this->data_)._M_t.
                    super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                    .
                    super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
                   ._M_head_impl)->extra_sinks,&sink_local);
    return this;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&death_message,"Check sink failed: ",local_48);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_48,"null LogSink*",&local_51);
  std::__cxx11::string::append((string *)&death_message);
  std::__cxx11::string::~string((string *)local_48);
  (*(code *)raw_log_internal::internal_log_function_abi_cxx11_)
            (3,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/log/internal/log_message.cc"
             ,0x163,&death_message);
  __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/log/internal/log_message.cc"
                ,0x163,
                "LogMessage &absl::log_internal::LogMessage::ToSinkAlso(absl::Nonnull<absl::LogSink *>)"
               );
}

Assistant:

LogMessage& LogMessage::ToSinkAlso(absl::Nonnull<absl::LogSink*> sink) {
  ABSL_INTERNAL_CHECK(sink, "null LogSink*");
  data_->extra_sinks.push_back(sink);
  return *this;
}